

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O1

int __thiscall ModelWriter::fprintf_param_int_array(ModelWriter *this,int id,Mat *m,FILE *pp)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  
  uVar1 = m->w;
  pvVar2 = m->data;
  fprintf((FILE *)pp," -%d=%d",(ulong)(id + 0x5b04),(ulong)uVar1);
  if (0 < (long)(int)uVar1) {
    lVar3 = 0;
    do {
      fprintf((FILE *)pp,",%d",(ulong)*(uint *)((long)pvVar2 + lVar3 * 4));
      lVar3 = lVar3 + 1;
    } while ((int)uVar1 != lVar3);
  }
  return 0;
}

Assistant:

int ModelWriter::fprintf_param_int_array(int id, const ncnn::Mat& m, FILE* pp)
{
    const int count = m.w;
    const int* ptr = m;

    fprintf(pp, " -%d=%d", 23300 + id, count);
    for (int i = 0; i < count; i++)
    {
        fprintf(pp, ",%d", ptr[i]);
    }

    return 0;
}